

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher.c
# Opt level: O3

int get_zeros_padding(uchar *input,size_t input_len,size_t *data_len)

{
  int iVar1;
  ulong uVar2;
  byte bVar3;
  byte bVar4;
  ulong uVar5;
  
  iVar1 = -0x6100;
  if (data_len != (size_t *)0x0 && input != (uchar *)0x0) {
    *data_len = 0;
    iVar1 = 0;
    if (input_len != 0) {
      uVar2 = 0;
      bVar3 = 0;
      do {
        bVar4 = input[input_len - 1] != '\0' | bVar3;
        uVar5 = input_len;
        if (bVar4 == bVar3) {
          uVar5 = 0;
        }
        uVar2 = uVar2 | uVar5;
        *data_len = uVar2;
        input_len = input_len - 1;
        bVar3 = bVar4;
      } while (input_len != 0);
    }
  }
  return iVar1;
}

Assistant:

static int get_zeros_padding( unsigned char *input, size_t input_len,
                              size_t *data_len )
{
    size_t i;
    unsigned char done = 0, prev_done;

    if( NULL == input || NULL == data_len )
        return( MBEDTLS_ERR_CIPHER_BAD_INPUT_DATA );

    *data_len = 0;
    for( i = input_len; i > 0; i-- )
    {
        prev_done = done;
        done |= ( input[i-1] != 0 );
        *data_len |= i * ( done != prev_done );
    }

    return( 0 );
}